

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O3

void Fixpp::impl::
     visitMessage<Fixpp::impl::MessageVisitor<should_be_able_to_return_value_in_visitor::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>,DefaultTestRules<Fixpp::v42::Spec::Dictionary>,Fixpp::TypedParsingContext<int>>
               (ParsingContext *context)

{
  char *pcVar1;
  VisitStatus VVar2;
  size_type *local_60;
  string msgTypeStr;
  string versionStr;
  
  VVar2 = visitDictionary<Fixpp::v42::Spec::Dictionary,Fixpp::TypedParsingContext<int>,Fixpp::impl::MessageVisitor<should_be_able_to_return_value_in_visitor::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
                    ();
  if (VVar2 == NotFound) {
    pcVar1 = (context->version).first;
    msgTypeStr.field_2._8_8_ = &versionStr._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&msgTypeStr.field_2 + 8),pcVar1,pcVar1 + (context->version).second);
    pcVar1 = (context->msgType).first;
    local_60 = &msgTypeStr._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,pcVar1,pcVar1 + (context->msgType).second);
    ParsingContext::setError
              (context,UnknownMessage,"Unknown MsgType(%s) for FIX version %s",local_60,
               msgTypeStr.field_2._8_8_);
    if (local_60 != &msgTypeStr._M_string_length) {
      operator_delete(local_60,msgTypeStr._M_string_length + 1);
    }
  }
  else {
    if (VVar2 != VersionMismatch) {
      return;
    }
    pcVar1 = (context->version).first;
    msgTypeStr.field_2._8_8_ = &versionStr._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&msgTypeStr.field_2 + 8),pcVar1,pcVar1 + (context->version).second);
    ParsingContext::setError
              (context,InvalidVersion,"FIX version mismatched, expected \'%s\', got \'%s\'",
               "FIX.4.2",msgTypeStr.field_2._8_8_);
  }
  if ((size_type *)msgTypeStr.field_2._8_8_ != &versionStr._M_string_length) {
    operator_delete((void *)msgTypeStr.field_2._8_8_,versionStr._M_string_length + 1);
  }
  return;
}

Assistant:

void visitMessage(Context& context, Visitor& visitor, Rules rules)
        {

            using Dictionary = typename Rules::Dictionary;
            using Version = typename Dictionary::Version;

            auto status = visitDictionary<Dictionary>(context, visitor, rules);

            if (status == VisitStatus::VersionMismatch)
            {
                std::string versionStr(context.version.first, context.version.second);

                context.setError(ErrorKind::InvalidVersion, "FIX version mismatched, expected '%s', got '%s'",
                        Version::Str, versionStr.c_str());
            }
            else if (status == VisitStatus::NotFound)
            {
                std::string versionStr(context.version.first, context.version.second);
                std::string msgTypeStr(context.msgType.first, context.msgType.second);

                context.setError(ErrorKind::UnknownMessage, "Unknown MsgType(%s) for FIX version %s", msgTypeStr.c_str(), versionStr.c_str());
            }
        }